

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink.c
# Opt level: O0

Gia_Man_t * Gia_ManMapShrink4(Gia_Man_t *p,int fKeepLevel,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  void *__ptr;
  Vec_Int_t *p_00;
  Vec_Int_t *vTruth_00;
  Vec_Int_t *vVisited_00;
  Vec_Int_t *vLeavesBest2;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  char *pcVar7;
  int *piVar8;
  uint *pIn;
  abctime aVar9;
  bool bVar10;
  int local_ec;
  int Counter;
  int *pLutClass;
  abctime clk;
  int local_70;
  int iFan;
  int k;
  int i;
  uint *pTruth;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vLeavesBest;
  Vec_Int_t *vVisited;
  Vec_Int_t *vTruth;
  Vec_Int_t *vLeaves;
  int fVerbose_local;
  int fKeepLevel_local;
  Gia_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    iVar1 = Gia_ManLutSizeMax(p);
    if (iVar1 < 5) {
      iVar1 = Gia_ManObjNum(p);
      __ptr = calloc((long)iVar1,4);
      p_00 = Vec_IntAlloc(0);
      vTruth_00 = Vec_IntAlloc(0x10000);
      vVisited_00 = Vec_IntAlloc(0);
      vLeavesBest2 = Vec_IntAlloc(4);
      Dar_LibPrepare(5);
      Gia_ManCleanTruth(p);
      Gia_ManSetPhase(p);
      Gia_ManFillValue(p);
      pGVar6 = Gia_ManConst0(p);
      pGVar6->Value = 0;
      iVar1 = Gia_ManObjNum(p);
      p_01 = Gia_ManStart(iVar1);
      pcVar7 = Abc_UtilStrsav(p->pName);
      p_01->pName = pcVar7;
      pcVar7 = Abc_UtilStrsav(p->pSpec);
      p_01->pSpec = pcVar7;
      Gia_ManHashAlloc(p_01);
      iVar1 = Gia_ManObjNum(p);
      Gia_ManCleanLevels(p_01,iVar1);
      iFan = 1;
      while( true ) {
        bVar10 = false;
        if (iFan < p->nObjs) {
          pFanin = Gia_ManObj(p,iFan);
          bVar10 = pFanin != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        iVar1 = Gia_ObjIsCi(pFanin);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo(pFanin);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsLut(p,iFan);
            if (iVar1 != 0) {
              Vec_IntClear(p_00);
              for (local_70 = 0; iVar1 = Gia_ObjLutSize(p,iFan), local_70 < iVar1;
                  local_70 = local_70 + 1) {
                piVar8 = Gia_ObjLutFanins(p,iFan);
                Vec_IntPush(p_00,piVar8[local_70]);
              }
              for (; local_70 < 4; local_70 = local_70 + 1) {
                Vec_IntPush(p_00,0);
              }
              pIn = Gia_ManConvertAigToTruth(p,pFanin,p_00,vTruth_00,vVisited_00);
              local_70 = 0;
              while( true ) {
                iVar1 = Vec_IntSize(p_00);
                bVar10 = false;
                if (local_70 < iVar1) {
                  iVar1 = Vec_IntEntry(p_00,local_70);
                  pTruth = (uint *)Gia_ManObj(p,iVar1);
                  bVar10 = (Gia_Obj_t *)pTruth != (Gia_Obj_t *)0x0;
                }
                if (!bVar10) break;
                iVar1 = Gia_ObjValue((Gia_Obj_t *)pTruth);
                if (iVar1 == -1) {
                  local_ec = 0;
                }
                else {
                  local_ec = Gia_ObjValue((Gia_Obj_t *)pTruth);
                }
                Vec_IntWriteEntry(p_00,local_70,local_ec);
                local_70 = local_70 + 1;
              }
              iVar1 = Vec_IntSize(p_00);
              iVar1 = Gia_ManTruthIsConst0(pIn,iVar1);
              if (iVar1 == 0) {
                iVar1 = Vec_IntSize(p_00);
                iVar1 = Gia_ManTruthIsConst1(pIn,iVar1);
                if (iVar1 == 0) {
                  uVar3 = Dar_LibEvalBuild(p_01,p_00,*pIn & 0xffff,fKeepLevel,vLeavesBest2);
                  pFanin->Value = uVar3;
                  uVar3 = pFanin->Value;
                  uVar4 = Gia_ObjPhaseRealLit(p_01,pFanin->Value);
                  uVar3 = Abc_LitNotCond(uVar3,uVar4 ^ (uint)((ulong)*(undefined8 *)pFanin >> 0x3f))
                  ;
                  pFanin->Value = uVar3;
                }
                else {
                  pFanin->Value = 1;
                }
              }
              else {
                pFanin->Value = 0;
              }
            }
          }
          else {
            iVar1 = Gia_ObjFanin0Copy(pFanin);
            uVar3 = Gia_ManAppendCo(p_01,iVar1);
            pFanin->Value = uVar3;
          }
        }
        else {
          uVar3 = Gia_ManAppendCi(p_01);
          pFanin->Value = uVar3;
          if (p->vLevels != (Vec_Int_t *)0x0) {
            iVar1 = Gia_ObjValue(pFanin);
            pGVar6 = Gia_ObjFromLit(p_01,iVar1);
            iVar1 = Gia_ObjLevel(p,pFanin);
            Gia_ObjSetLevel(p_01,pGVar6,iVar1);
          }
        }
        iFan = iFan + 1;
      }
      Gia_ManHashStop(p_01);
      iVar1 = Gia_ManHasDangling(p_01);
      pTemp = p_01;
      if (iVar1 != 0) {
        pTemp = Gia_ManCleanup(p_01);
        if (fVerbose != 0) {
          iVar1 = Gia_ManAndNum(pTemp);
          iVar2 = Gia_ManAndNum(p_01);
          if (iVar1 != iVar2) {
            uVar3 = Gia_ManAndNum(p_01);
            uVar4 = Gia_ManAndNum(pTemp);
            printf("Gia_ManMapShrink4() node reduction after sweep %6d -> %6d.\n",(ulong)uVar3,
                   (ulong)uVar4);
          }
        }
        Gia_ManStop(p_01);
      }
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(pTemp,iVar1);
      Vec_IntFree(p_00);
      Vec_IntFree(vTruth_00);
      Vec_IntFree(vVisited_00);
      Vec_IntFree(vLeavesBest2);
      if (fVerbose != 0) {
        iVar1 = Gia_ManObjNum(p);
        iVar2 = Gia_ManObjNum(pTemp);
        printf("Total gain in AIG nodes = %d.  ",(ulong)(uint)(iVar1 - iVar2));
        Abc_Print(1,"%s =","Total runtime");
        aVar9 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar5) * 1.0) / 1000000.0);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      p_local = pTemp;
    }
    else {
      printf("Resynthesis is not performed when nodes have more than 4 inputs.\n");
      p_local = (Gia_Man_t *)0x0;
    }
    return p_local;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink.c"
                ,0x3b,"Gia_Man_t *Gia_ManMapShrink4(Gia_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManMapShrink4( Gia_Man_t * p, int fKeepLevel, int fVerbose )
{
    Vec_Int_t * vLeaves, * vTruth, * vVisited, * vLeavesBest;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFanin;
    unsigned * pTruth;
    int i, k, iFan;
    abctime clk = Abc_Clock();
//    int ClassCounts[222] = {0};
    int * pLutClass, Counter = 0;
    assert( Gia_ManHasMapping(p) );
    if ( Gia_ManLutSizeMax( p ) > 4 )
    {
        printf( "Resynthesis is not performed when nodes have more than 4 inputs.\n" );
        return NULL;
    }
    pLutClass   = ABC_CALLOC( int, Gia_ManObjNum(p) );
    vLeaves     = Vec_IntAlloc( 0 );
    vTruth      = Vec_IntAlloc( (1<<16) );
    vVisited    = Vec_IntAlloc( 0 );
    vLeavesBest = Vec_IntAlloc( 4 );
    // prepare the library
    Dar_LibPrepare( 5 ); 
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pNew, Gia_ObjFromLit(pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            Counter++;
            // collect leaves of this gate
            Vec_IntClear( vLeaves );
            Gia_LutForEachFanin( p, i, iFan, k )
                Vec_IntPush( vLeaves, iFan );
            for ( ; k < 4; k++ )
                Vec_IntPush( vLeaves, 0 );
            //.compute the truth table 
            pTruth = Gia_ManConvertAigToTruth( p, pObj, vLeaves, vTruth, vVisited );
            // change from node IDs to their literals
            Gia_ManForEachObjVec( vLeaves, p, pFanin, k )
            {
//                assert( Gia_ObjValue(pFanin) != ~0 ); 
                Vec_IntWriteEntry( vLeaves, k, Gia_ObjValue(pFanin) != ~0 ? Gia_ObjValue(pFanin) : 0 );
            }
            // derive new structre
            if ( Gia_ManTruthIsConst0(pTruth, Vec_IntSize(vLeaves)) )
                pObj->Value = 0;
            else if ( Gia_ManTruthIsConst1(pTruth, Vec_IntSize(vLeaves)) )
                pObj->Value = 1;
            else
            {
                pObj->Value = Dar_LibEvalBuild( pNew, vLeaves, 0xffff & *pTruth, fKeepLevel, vLeavesBest );
                pObj->Value = Abc_LitNotCond( pObj->Value, Gia_ObjPhaseRealLit(pNew, pObj->Value) ^ pObj->fPhase );
            }
        }
    }
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( fVerbose && Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManMapShrink4() node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFree( vLeavesBest );
    if ( fVerbose )
    {
        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    ABC_FREE( pLutClass );
    return pNew;
}